

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

int Curl_poll(pollfd *ufds,uint nfds,int timeout_ms)

{
  pollfd *ppVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  time_t tVar5;
  int *piVar6;
  timediff_t tVar7;
  char cVar8;
  ulong uVar9;
  ushort uVar10;
  int iVar11;
  ulong __nfds;
  int iVar12;
  curltime cVar13;
  curltime newer;
  int local_34;
  
  if (ufds == (pollfd *)0x0) {
LAB_0010dec8:
    iVar11 = Curl_wait_ms(timeout_ms);
    return iVar11;
  }
  __nfds = (ulong)nfds;
  uVar9 = 0;
  do {
    if (__nfds == uVar9) goto LAB_0010dec8;
    ppVar1 = ufds + uVar9;
    uVar9 = uVar9 + 1;
  } while (ppVar1->fd == -1);
  if (timeout_ms < 1) {
    iVar11 = 0;
    local_34 = 0;
    tVar5 = 0;
  }
  else {
    cVar13 = Curl_now();
    tVar5 = cVar13.tv_sec;
    local_34 = cVar13.tv_usec;
    iVar11 = timeout_ms;
  }
  while( true ) {
    if (timeout_ms == 0) {
      iVar11 = timeout_ms;
    }
    iVar12 = -1;
    if (timeout_ms < 0) {
      iVar11 = iVar12;
    }
    iVar4 = poll((pollfd *)ufds,__nfds,iVar11);
    if (iVar4 != -1) break;
    piVar6 = __errno_location();
    iVar3 = *piVar6;
    iVar4 = iVar12;
    if (iVar3 == 0) {
      if (0 < timeout_ms) goto LAB_0010df39;
      cVar8 = '\0';
    }
    else if (timeout_ms < 1 || (iVar3 != 4 || Curl_ack_eintr != 0)) {
      cVar8 = (iVar3 != 4 || Curl_ack_eintr != 0) * '\x05';
    }
    else {
LAB_0010df39:
      cVar13 = Curl_now();
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar13._0_12_,0);
      newer.tv_usec = SUB124(cVar13._0_12_,8);
      cVar13.tv_usec = local_34;
      cVar13.tv_sec = tVar5;
      cVar13._12_4_ = 0;
      tVar7 = Curl_timediff(newer,cVar13);
      iVar11 = timeout_ms - (int)tVar7;
      cVar8 = (iVar11 < 1) * '\x05';
      iVar4 = -(uint)(iVar11 != 0 && (int)tVar7 <= timeout_ms);
    }
    if ((iVar4 != -1) || (cVar8 != '\0')) break;
  }
  if (iVar4 < 0) {
    iVar4 = -1;
  }
  else if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    for (uVar9 = 0; __nfds != uVar9; uVar9 = uVar9 + 1) {
      if ((ufds[uVar9].fd != -1) && (uVar2 = ufds[uVar9].revents, (uVar2 & 0x18) != 0)) {
        uVar10 = uVar2 >> 4 & 1;
        if ((uVar2 & 8) != 0) {
          uVar10 = 5;
        }
        ufds[uVar9].revents = uVar10 | uVar2;
      }
    }
  }
  return iVar4;
}

Assistant:

int Curl_poll(struct pollfd ufds[], unsigned int nfds, int timeout_ms)
{
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
  struct timeval *ptimeout;
  fd_set fds_read;
  fd_set fds_write;
  fd_set fds_err;
  curl_socket_t maxfd;
#endif
  struct curltime initial_tv = {0, 0};
  bool fds_none = TRUE;
  unsigned int i;
  int pending_ms = 0;
  int r;

  if(ufds) {
    for(i = 0; i < nfds; i++) {
      if(ufds[i].fd != CURL_SOCKET_BAD) {
        fds_none = FALSE;
        break;
      }
    }
  }
  if(fds_none) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }

  /* Avoid initial timestamp, avoid Curl_now() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  if(timeout_ms > 0) {
    pending_ms = timeout_ms;
    initial_tv = Curl_now();
  }

#ifdef HAVE_POLL_FINE

  do {
    int error;
    if(timeout_ms < 0)
      pending_ms = -1;
    else if(!timeout_ms)
      pending_ms = 0;
    r = poll(ufds, nfds, pending_ms);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    if(timeout_ms > 0) {
      pending_ms = (int)(timeout_ms - ELAPSED_MS());
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  for(i = 0; i < nfds; i++) {
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(ufds[i].revents & POLLHUP)
      ufds[i].revents |= POLLIN;
    if(ufds[i].revents & POLLERR)
      ufds[i].revents |= (POLLIN|POLLOUT);
  }

#else  /* HAVE_POLL_FINE */

  FD_ZERO(&fds_read);
  FD_ZERO(&fds_write);
  FD_ZERO(&fds_err);
  maxfd = (curl_socket_t)-1;

  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    VERIFY_SOCK(ufds[i].fd);
    if(ufds[i].events & (POLLIN|POLLOUT|POLLPRI|
                          POLLRDNORM|POLLWRNORM|POLLRDBAND)) {
      if(ufds[i].fd > maxfd)
        maxfd = ufds[i].fd;
      if(ufds[i].events & (POLLRDNORM|POLLIN))
        FD_SET(ufds[i].fd, &fds_read);
      if(ufds[i].events & (POLLWRNORM|POLLOUT))
        FD_SET(ufds[i].fd, &fds_write);
      if(ufds[i].events & (POLLRDBAND|POLLPRI))
        FD_SET(ufds[i].fd, &fds_err);
    }
  }

#ifdef USE_WINSOCK
  /* WinSock select() can't handle zero events.  See the comment about this in
     Curl_check_socket(). */
  if(fds_read.fd_count == 0 && fds_write.fd_count == 0
     && fds_err.fd_count == 0) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }
#endif

  ptimeout = (timeout_ms < 0) ? NULL : &pending_tv;

  do {
    int error;
    if(timeout_ms > 0) {
      pending_tv.tv_sec = pending_ms / 1000;
      pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    }
    else if(!timeout_ms) {
      pending_tv.tv_sec = 0;
      pending_tv.tv_usec = 0;
    }

#ifdef USE_WINSOCK
    r = select((int)maxfd + 1,
               /* WinSock select() can't handle fd_sets with zero bits set, so
                  don't give it such arguments.  See the comment about this in
                  Curl_check_socket().
               */
               fds_read.fd_count ? &fds_read : NULL,
               fds_write.fd_count ? &fds_write : NULL,
               fds_err.fd_count ? &fds_err : NULL, ptimeout);
#else
    r = select((int)maxfd + 1, &fds_read, &fds_write, &fds_err, ptimeout);
#endif
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - ELAPSED_MS();
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  r = 0;
  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(FD_ISSET(ufds[i].fd, &fds_read))
      ufds[i].revents |= POLLIN;
    if(FD_ISSET(ufds[i].fd, &fds_write))
      ufds[i].revents |= POLLOUT;
    if(FD_ISSET(ufds[i].fd, &fds_err))
      ufds[i].revents |= POLLPRI;
    if(ufds[i].revents != 0)
      r++;
  }

#endif  /* HAVE_POLL_FINE */

  return r;
}